

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool container_iterator_prev
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,uint16_t *value)

{
  long lVar1;
  uint uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  ulong uVar7;
  
  iVar5 = (int)CONCAT71(in_register_00000031,typecode);
  if (iVar5 == 3) {
    if (*value != 0) {
      uVar3 = *value - 1;
      *value = uVar3;
      lVar1 = *(long *)((long)c + 8);
      iVar5 = it->index;
      if (*(ushort *)(lVar1 + (long)iVar5 * 4) <= uVar3) {
        return true;
      }
      uVar4 = iVar5 - 1;
      it->index = uVar4;
      if (0 < iVar5) {
        uVar4 = (uint)(ushort)(*(short *)(lVar1 + 2 + (ulong)uVar4 * 4) +
                              *(short *)(lVar1 + (ulong)uVar4 * 4));
        goto LAB_00110b32;
      }
    }
  }
  else if (iVar5 == 2) {
    iVar5 = it->index;
    uVar4 = iVar5 - 1;
    it->index = uVar4;
    if (0 < iVar5) {
      uVar4 = (uint)*(ushort *)(*(long *)((long)c + 8) + (ulong)uVar4 * 2);
LAB_00110b32:
      *value = (uint16_t)uVar4;
      return true;
    }
  }
  else {
    iVar5 = it->index;
    uVar4 = iVar5 - 1;
    it->index = uVar4;
    if (0 < iVar5) {
      uVar6 = (ulong)(uVar4 >> 6);
      uVar2 = uVar4 & 0xffffffc0;
      uVar7 = (ulong)(*(long *)(*(long *)((long)c + 8) + uVar6 * 8) << (~(byte)uVar4 & 0x3f)) >>
              (~(byte)uVar4 & 0x3f);
      while (uVar7 == 0) {
        if ((long)uVar6 < 1) {
          return false;
        }
        lVar1 = uVar6 * 8;
        uVar6 = uVar6 - 1;
        uVar2 = uVar2 - 0x40;
        uVar7 = *(ulong *)(*(long *)((long)c + 8) + -8 + lVar1);
      }
      lVar1 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar4 = ((uint)lVar1 ^ 0x3f) + uVar2 ^ 0x3f;
      it->index = uVar4;
      goto LAB_00110b32;
    }
  }
  return false;
}

Assistant:

bool container_iterator_prev(const container_t *c, uint8_t typecode,
                             roaring_container_iterator_t *it,
                             uint16_t *value) {
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            if (--it->index < 0) {
                return false;
            }

            const bitset_container_t *bc = const_CAST_bitset(c);
            int32_t wordindex = it->index / 64;
            uint64_t word =
                bc->words[wordindex] & (UINT64_MAX >> (63 - (it->index % 64)));

            while (word == 0 && --wordindex >= 0) {
                word = bc->words[wordindex];
            }
            if (word == 0) {
                return false;
            }

            it->index = (wordindex * 64) + (63 - roaring_leading_zeroes(word));
            *value = it->index;
            return true;
        }
        case ARRAY_CONTAINER_TYPE: {
            if (--it->index < 0) {
                return false;
            }
            const array_container_t *ac = const_CAST_array(c);
            *value = ac->array[it->index];
            return true;
        }
        case RUN_CONTAINER_TYPE: {
            if (*value == 0) {
                return false;
            }

            const run_container_t *rc = const_CAST_run(c);
            (*value)--;
            if (*value >= rc->runs[it->index].value) {
                return true;
            }

            if (--it->index < 0) {
                return false;
            }

            *value = rc->runs[it->index].value + rc->runs[it->index].length;
            return true;
        }
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}